

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modulename.cpp
# Opt level: O0

char * PAL_dladdr(LPVOID ProcAddress)

{
  int iVar1;
  LPVOID local_38;
  Dl_info dl_info;
  LPVOID ProcAddress_local;
  
  dl_info.dli_saddr = ProcAddress;
  iVar1 = dladdr(ProcAddress,&local_38);
  if (iVar1 == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    dlerror();
    ProcAddress_local = (LPVOID)0x0;
  }
  else {
    ProcAddress_local = local_38;
  }
  return (char *)ProcAddress_local;
}

Assistant:

const char *PAL_dladdr(LPVOID ProcAddress)
{
#if defined(_AIX) || defined(__hppa__)
    /* dladdr is not supported on AIX or 32-bit HPUX-PARISC */
    return (NULL);
#elif defined(_HPUX_) && defined(_IA64_)
    /* dladdr is not supported on HP-UX/IA64.  That said, PAL_dladdr just returns to module name
       and we can get that via dlgetname.  So use that for HPUX.  */
    {
        char*               pszName = NULL;
        load_module_desc    desc;
        __uint64_t          uimodret = NULL;
        uimodret = dlmodinfo((__uint64_t)ProcAddress, &desc, sizeof(desc), NULL, 0, 0);
        if (!uimodret)
        {
            WARN("dlmodinfo call failed! dlerror says '%s'\n", dlerror());
            return NULL;
        }
        pszName = dlgetname(&desc, sizeof(desc), NULL, 0, 0);
        if (!pszName)
        {
            WARN("dlgetname desc didn't describe a loaded module?! dlerror says '%s'\n", dlerror());
            return NULL;
        }
        return pszName;
    }
#else
    Dl_info dl_info;
    if (!dladdr(ProcAddress, &dl_info))
    {
        WARN("dladdr() call failed! dlerror says '%s'\n", dlerror());
        /* If we get an error, return NULL */
        return (NULL);
    }
    else 
    {
        /* Return the module name */ 
        return dl_info.dli_fname;
    }
#endif
}